

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keytap2.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  double dVar1;
  pointer psVar2;
  bool bVar3;
  time_t tVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  int iVar9;
  stKeyPressData<short> *k_2;
  ulong uVar10;
  pointer psVar11;
  int j;
  uint uVar12;
  stKeyPressData<short> *k;
  ulong uVar13;
  stKeyPressData<short> *k_1;
  allocator<char> local_d9;
  TKeyPressCollection keyPresses;
  TWaveform waveformInput;
  TSimilarityMap similarityMap;
  TWaveform waveformMax;
  TWaveform waveformThreshold;
  
  tVar4 = time((time_t *)0x0);
  srand((uint)tVar4);
  printf("Usage: %s record.kbd\n",*argv);
  if (argc < 2) {
    iVar9 = -1;
  }
  else {
    waveformInput.super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    waveformInput.super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    waveformInput.super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    printf("[+] Loading recording from \'%s\'\n",argv[1]);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&keyPresses,argv[1],(allocator<char> *)&similarityMap);
    bVar3 = readFromFile<float,short>((string *)&keyPresses,&waveformInput);
    std::__cxx11::string::~string((string *)&keyPresses);
    if (bVar3) {
      printf("[+] Loaded recording: of %d samples (sample size = %d bytes)\n",
             (ulong)((long)waveformInput.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                    (long)waveformInput.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                          super__Vector_impl_data._M_start) >> 1,2);
      printf("    Size in memory:          %g MB\n",
             SUB84((double)((float)(ulong)((long)waveformInput.
                                                 super__Vector_base<short,_std::allocator<short>_>.
                                                 _M_impl.super__Vector_impl_data._M_finish -
                                          (long)waveformInput.
                                                super__Vector_base<short,_std::allocator<short>_>.
                                                _M_impl.super__Vector_impl_data._M_start) *
                            0.0009765625 * 0.0009765625),0));
      printf("    Sample size:             %d\n",2);
      printf("    Total number of samples: %d\n",
             (ulong)((long)waveformInput.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                    (long)waveformInput.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                          super__Vector_impl_data._M_start) >> 1);
      printf("    Recording length:        %g seconds\n",
             SUB84((double)((float)(ulong)((long)waveformInput.
                                                 super__Vector_base<short,_std::allocator<short>_>.
                                                 _M_impl.super__Vector_impl_data._M_finish -
                                           (long)waveformInput.
                                                 super__Vector_base<short,_std::allocator<short>_>.
                                                 _M_impl.super__Vector_impl_data._M_start >> 1) /
                           24000.0),0));
      keyPresses.super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>.
      super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
      keyPresses._20_8_ = 0;
      keyPresses.super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>.
      super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      keyPresses.super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>.
      super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>._M_impl.
      super__Vector_impl_data._M_finish._0_4_ = 0;
      keyPresses.super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>.
      super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>._M_impl.
      super__Vector_impl_data._M_finish._4_4_ = 0;
      waveformThreshold.super__Vector_base<short,_std::allocator<short>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      waveformThreshold.super__Vector_base<short,_std::allocator<short>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      waveformThreshold.super__Vector_base<short,_std::allocator<short>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      waveformMax.super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      waveformMax.super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      waveformMax.super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      lVar5 = std::chrono::_V2::system_clock::now();
      puts("[+] Searching for key presses");
      similarityMap.
      super__Vector_base<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           (pointer)((long)waveformInput.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                     (long)waveformInput.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                           super__Vector_impl_data._M_start >> 1);
      similarityMap.
      super__Vector_base<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)waveformInput.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                    super__Vector_impl_data._M_start;
      bVar3 = findKeyPresses<short>
                        ((TWaveformViewT<short> *)&similarityMap,&keyPresses,&waveformThreshold,
                         &waveformMax,8.0,0x200,0x800,true);
      if (bVar3) {
        lVar6 = std::chrono::_V2::system_clock::now();
        lVar7 = CONCAT44(keyPresses.
                         super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>
                         .
                         super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                         keyPresses.
                         super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>
                         .
                         super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish._0_4_) -
                (long)keyPresses.
                      super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>.
                      super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
        printf("[+] Detected a total of %d potential key presses\n",lVar7 / 0x30 & 0xffffffff,
               lVar7 % 0x30);
        psVar2 = (pointer)CONCAT44(keyPresses.
                                   super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>
                                   .
                                   super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                                   keyPresses.
                                   super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>
                                   .
                                   super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish._0_4_);
        for (psVar11 = keyPresses.
                       super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>.
                       super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>
                       ._M_impl.super__Vector_impl_data._M_start; psVar11 != psVar2;
            psVar11 = psVar11 + 1) {
          printf("    position - %d\n",(ulong)(uint)psVar11->pos);
        }
        printf("[+] Search took %4.3f seconds\n",
               SUB84((double)((float)((lVar6 - lVar5) / 1000000) / 1000.0),0));
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&similarityMap,"key_presses.plot",&local_d9);
        dumpKeyPresses<short>((string *)&similarityMap,&keyPresses);
        std::__cxx11::string::~string((string *)&similarityMap);
        similarityMap.
        super__Vector_base<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        similarityMap.
        super__Vector_base<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        similarityMap.
        super__Vector_base<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        lVar5 = std::chrono::_V2::system_clock::now();
        puts("[+] Calculating CC similarity map");
        bVar3 = calculateSimilartyMap<short>(0x100,0x100,0,&keyPresses,&similarityMap);
        if (bVar3) {
          lVar6 = std::chrono::_V2::system_clock::now();
          printf("[+] Calculation took %4.3f seconds\n",
                 SUB84((double)((float)((lVar6 - lVar5) / 1000000) / 1000.0),0));
          uVar8 = (CONCAT44(keyPresses.
                            super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>
                            .
                            super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                            keyPresses.
                            super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>
                            .
                            super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish._0_4_) -
                  (long)keyPresses.
                        super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>
                        .
                        super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>
                        ._M_impl.super__Vector_impl_data._M_start) / 0x30;
          uVar10 = 0;
          uVar13 = uVar8 & 0xffffffff;
          if ((int)uVar8 < 1) {
            uVar13 = uVar10;
          }
          lVar5 = 0x18;
          for (; uVar13 != uVar10; uVar10 = uVar10 + 1) {
            printf("    Average CC for keypress %4d - %6.3f\n",
                   (int)*(undefined8 *)
                         ((long)&((keyPresses.
                                   super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>
                                   .
                                   super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->waveform).samples +
                         lVar5),uVar10 & 0xffffffff);
            lVar5 = lVar5 + 0x30;
          }
          printf("%5d ",0xffffffffffffffff);
          for (uVar12 = 0; (uint)uVar13 != uVar12; uVar12 = uVar12 + 1) {
            printf("%4d ",(ulong)uVar12);
          }
          putchar(10);
          puts(
              "--------------------------------------------------------------------------------------------------------------------------------------"
              );
          for (uVar10 = 0; uVar10 != uVar13; uVar10 = uVar10 + 1) {
            printf("%2d  | ",uVar10 & 0xffffffff);
            for (lVar5 = 0; (uVar8 & 0xffffffff) << 4 != lVar5; lVar5 = lVar5 + 0x10) {
              dVar1 = *(double *)
                       ((long)&(similarityMap.
                                super__Vector_base<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[uVar10].
                                super__Vector_base<stMatch,_std::allocator<stMatch>_>._M_impl.
                                super__Vector_impl_data._M_start)->cc + lVar5);
              if (dVar1 <= -0.45) {
                printf("     ");
              }
              else {
                printf("%4.0f ",SUB84(dVar1 * 100.0,0));
              }
            }
            putchar(10);
          }
          putchar(10);
          clusterG(&similarityMap,&keyPresses);
          psVar2 = (pointer)CONCAT44(keyPresses.
                                     super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>
                                     .
                                     super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                                     keyPresses.
                                     super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>
                                     .
                                     super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish._0_4_);
          for (psVar11 = keyPresses.
                         super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>
                         .
                         super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>
                         ._M_impl.super__Vector_impl_data._M_start; psVar11 != psVar2;
              psVar11 = psVar11 + 1) {
            printf("%d ",(ulong)(uint)psVar11->cid);
          }
          putchar(10);
          psVar2 = (pointer)CONCAT44(keyPresses.
                                     super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>
                                     .
                                     super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                                     keyPresses.
                                     super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>
                                     .
                                     super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish._0_4_);
          for (psVar11 = keyPresses.
                         super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>
                         .
                         super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>
                         ._M_impl.super__Vector_impl_data._M_start; psVar11 != psVar2;
              psVar11 = psVar11 + 1) {
            putchar(psVar11->cid + 0x60);
          }
          putchar(10);
          iVar9 = 0;
        }
        else {
          puts("Failed to calculate similariy map");
          iVar9 = -3;
        }
        std::
        vector<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
        ::~vector(&similarityMap);
      }
      else {
        puts("Failed to detect keypresses");
        iVar9 = -2;
      }
      std::_Vector_base<short,_std::allocator<short>_>::~_Vector_base
                (&waveformMax.super__Vector_base<short,_std::allocator<short>_>);
      std::_Vector_base<short,_std::allocator<short>_>::~_Vector_base
                (&waveformThreshold.super__Vector_base<short,_std::allocator<short>_>);
      std::_Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>::
      ~_Vector_base((_Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_> *)
                    &keyPresses);
    }
    else {
      printf("Specified file \'%s\' does not exist\n",argv[1]);
      iVar9 = -1;
    }
    std::_Vector_base<short,_std::allocator<short>_>::~_Vector_base
              (&waveformInput.super__Vector_base<short,_std::allocator<short>_>);
  }
  return iVar9;
}

Assistant:

int main(int argc, char ** argv) {
    srand(time(0));

    printf("Usage: %s record.kbd\n", argv[0]);
    if (argc < 2) {
        return -1;
    }

    int64_t sampleRate = 24000;

    TWaveform waveformInput;
    printf("[+] Loading recording from '%s'\n", argv[1]);
    if (readFromFile<TSampleF>(argv[1], waveformInput) == false) {
        printf("Specified file '%s' does not exist\n", argv[1]);
        return -1;
    }

    //{
    //    std::ofstream fout("waveform.plot");
    //    for (auto & a : waveformInput) {
    //        fout << a << std::endl;
    //    }
    //    fout.close();
    //}

    printf("[+] Loaded recording: of %d samples (sample size = %d bytes)\n", (int) waveformInput.size(), (int) sizeof(TSample));
    printf("    Size in memory:          %g MB\n", (float)(sizeof(TSample)*waveformInput.size())/1024/1024);
    printf("    Sample size:             %d\n", (int) sizeof(TSample));
    printf("    Total number of samples: %d\n", (int) waveformInput.size());
    printf("    Recording length:        %g seconds\n", (float)(waveformInput.size())/sampleRate);

    TKeyPressCollection keyPresses;
    TWaveform waveformThreshold;
    TWaveform waveformMax;
    {
        auto tStart = std::chrono::high_resolution_clock::now();
        printf("[+] Searching for key presses\n");
        if (findKeyPresses(getView(waveformInput, 0), keyPresses, waveformThreshold, waveformMax, 8.0, 512, 2*1024, true) == false) {
            printf("Failed to detect keypresses\n");
            return -2;
        }
        auto tEnd = std::chrono::high_resolution_clock::now();
        printf("[+] Detected a total of %d potential key presses\n", (int) keyPresses.size());
        for (auto & k : keyPresses) {
            auto & pos = k.pos;

            printf("    position - %d\n", (int) pos);
        }
        printf("[+] Search took %4.3f seconds\n", toSeconds(tStart, tEnd));

        dumpKeyPresses("key_presses.plot", keyPresses);
    }

    //keyPresses.erase(keyPresses.begin(), keyPresses.begin() + keyPresses.size()/2);

    TSimilarityMap similarityMap;
    {
        auto tStart = std::chrono::high_resolution_clock::now();
        printf("[+] Calculating CC similarity map\n");
        if (calculateSimilartyMap(256, 256, 0, keyPresses, similarityMap) == false) {
            printf("Failed to calculate similariy map\n");
            return -3;
        }
        auto tEnd = std::chrono::high_resolution_clock::now();
        printf("[+] Calculation took %4.3f seconds\n", toSeconds(tStart, tEnd));
    }

    int n = keyPresses.size();
    for (int i = 0; i < n; ++i) {
        auto & avgcc = keyPresses[i].ccAvg;

        printf("    Average CC for keypress %4d - %6.3f\n", i, avgcc);
    }

    printf("%5d ", -1);
    for (int j = 0; j < n; ++j) {
        printf("%4d ", j);
    }
    printf("\n");
    printf("--------------------------------------------------------------------------------------------------------------------------------------\n");

    for (int i = 0; i < n; ++i) {
        printf("%2d  | ", i);
        for (int j = 0; j < n; ++j) {
            auto cc     = similarityMap[i][j].cc;
            //auto offset = similarityMap[i][j].offset;

            if (cc > -0.45) {
                printf("%4.0f ", cc*100);
            } else {
                printf("     ");
            }
            //printf("%3d - %3d -> %4.3f, %3d\n", i, j, cc, (int) offset);
        }
        printf("\n");
    }

    printf("\n");

    //clusterDBSCAN(similarityMap, 0.8, 1, keyPresses);
    //clusterSimple(similarityMap, 0.50, keyPresses);
    clusterG(similarityMap, keyPresses);

    for (const auto & k : keyPresses) {
        auto & cid = k.cid;

        //printf("%c", 'a' + cid - 1);
        printf("%d ", cid);
    }
    printf("\n");

    for (const auto & k : keyPresses) {
        auto & cid = k.cid;

        printf("%c", 'a' + cid - 1);
    }
    printf("\n");

    return 0;
}